

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  ZSTD_customMem customMem;
  size_t sVar1;
  ZSTD_CCtx ctxBody;
  size_t result;
  undefined8 in_stack_fffffffffffffc38;
  int compressionLevel_00;
  size_t in_stack_fffffffffffffc40;
  void *in_stack_fffffffffffffc48;
  void *in_stack_fffffffffffffc50;
  void *in_stack_fffffffffffffc58;
  ZSTD_CCtx *in_stack_fffffffffffffc60;
  
  compressionLevel_00 = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  memset(&stack0xfffffffffffffc40,0,0x390);
  sVar1 = ZSTD_compressCCtx(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                            (size_t)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc40,compressionLevel_00);
  customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffc48;
  customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffc40;
  customMem.opaque = in_stack_fffffffffffffc50;
  ZSTD_free((ZSTD_freeFunction)0x0,customMem);
  return sVar1;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity, const void* src, size_t srcSize, int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    memset(&ctxBody, 0, sizeof(ctxBody));
    ctxBody.customMem = ZSTD_defaultCMem;
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_free(ctxBody.workSpace, ZSTD_defaultCMem);  /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}